

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadAddress
          (BinaryReader *this,Address *out_value,Index memory,char *desc)

{
  bool bVar1;
  uint local_34;
  char *pcStack_30;
  uint32_t val;
  char *desc_local;
  Address *pAStack_20;
  Index memory_local;
  Address *out_value_local;
  BinaryReader *this_local;
  Result res;
  
  pcStack_30 = desc;
  desc_local._4_4_ = memory;
  pAStack_20 = out_value;
  out_value_local = &this->read_end_;
  bVar1 = Features::memory64_enabled(&this->options_->features);
  if (bVar1) {
    this_local._4_4_ = ReadU64Leb128(this,pAStack_20,pcStack_30);
  }
  else {
    this_local._4_4_ = ReadU32Leb128(this,&local_34,pcStack_30);
    *pAStack_20 = (ulong)local_34;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadAddress(Address* out_value,
                                 Index memory,
                                 const char* desc) {
  if (options_.features.memory64_enabled()) {
    return ReadU64Leb128(out_value, desc);
  } else {
    uint32_t val;
    Result res = ReadU32Leb128(&val, desc);
    *out_value = val;
    return res;
  }
}